

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

void __thiscall
particleSamples::filter_particles_into_lists
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *full_list)

{
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *pvVar1;
  pointer paVar2;
  bool bVar3;
  int iVar4;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  **ppvVar5;
  particleSamples *this_00;
  anon_struct_120_15_f999644b *part_i;
  pointer __x;
  pointer ppvVar6;
  long lVar7;
  char cVar8;
  vector<particle_info,_std::allocator<particle_info>_> *local_58;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  **local_50;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  **local_48;
  pointer local_40;
  pointer local_38;
  
  this_00 = this;
  clear_out_previous_record(this,this->particle_list);
  if (this->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
    clear_out_previous_record(this_00,this->resonance_list_Sigma0);
  }
  if (this->net_particle_flag == 1) {
    clear_out_previous_record(this_00,this->anti_particle_list);
  }
  if (this->reconst_flag == 1) {
    clear_out_previous_record(this_00,this->reconst_list_1);
    clear_out_previous_record(this_00,this->reconst_list_2);
  }
  if (this->flag_charge_dependence == 1) {
    clear_out_previous_record(this_00,this->positive_charge_hadron_list);
    clear_out_previous_record(this_00,this->negative_charge_hadron_list);
  }
  if (this->analyze_BF == true) {
    clear_out_previous_record(this_00,this->balance_function_particle_a);
    clear_out_previous_record(this_00,this->balance_function_particle_abar);
    clear_out_previous_record(this_00,this->balance_function_particle_b);
    clear_out_previous_record(this_00,this->balance_function_particle_bbar);
  }
  ppvVar6 = (full_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (full_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_48 = &this->reconst_list_2;
  local_50 = &this->negative_charge_hadron_list;
  lVar7 = 0;
  do {
    if (ppvVar6 == local_40) {
      return;
    }
    pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
              *)this->particle_list;
    local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
    (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
    ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
    if (this->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->resonance_list_Sigma0;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
    }
    if (this->net_particle_flag == 1) {
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->anti_particle_list;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
    }
    if (this->reconst_flag == 1) {
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->reconst_list_1;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)*local_48;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
    }
    if (this->flag_charge_dependence == 1) {
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->positive_charge_hadron_list;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)*local_50;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
    }
    if (this->analyze_BF == true) {
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->balance_function_particle_a;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->balance_function_particle_abar;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->balance_function_particle_b;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
      pvVar1 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)this->balance_function_particle_bbar;
      local_58 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_58->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>(pvVar1,&local_58);
    }
    paVar2 = ((*ppvVar6)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    local_38 = ppvVar6;
    for (__x = ((*ppvVar6)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_start; __x != paVar2; __x = __x + 1) {
      bVar3 = decide_to_pick_OSCAR(this,this->particle_monval,__x->monval);
      if (bVar3) {
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((this->particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
      }
      if (this->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
        if (this->particle_monval == 0xc32) {
          if (__x->monval == 0xc8c) {
LAB_0011ccdc:
            std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                      ((this->resonance_list_Sigma0->
                       super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
          }
        }
        else if (__x->monval == -0xc8c && this->particle_monval == -0xc32) goto LAB_0011ccdc;
      }
      if (this->reconst_flag == 1) {
        cVar8 = __x->monval == 0x141;
        if (__x->monval == -0x141) {
          cVar8 = '\x02';
        }
        if (this->particle_monval != 0x14d) {
          cVar8 = '\0';
        }
        ppvVar5 = &this->reconst_list_1;
        if ((cVar8 == '\x01') || (ppvVar5 = local_48, cVar8 == '\x02')) {
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    (((*ppvVar5)->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
        }
      }
      if ((this->net_particle_flag == 1) &&
         (iVar4 = decide_to_pick_anti_particles(this,__x->monval), iVar4 != 0)) {
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((this->anti_particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
      }
      if ((this->flag_charge_dependence == 1) &&
         ((iVar4 = decide_to_pick_charge(this,__x->monval),
          ppvVar5 = &this->positive_charge_hadron_list, iVar4 == 1 ||
          (ppvVar5 = local_50, iVar4 == -1)))) {
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (((*ppvVar5)->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
      }
      if (this->analyze_BF == true) {
        bVar3 = decide_to_pick_OSCAR(this,this->particle_monval_a,__x->monval);
        if (bVar3) {
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((this->balance_function_particle_a->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
        }
        bVar3 = decide_to_pick_OSCAR(this,this->particle_monval_abar,__x->monval);
        if (bVar3) {
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((this->balance_function_particle_abar->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
        }
        bVar3 = decide_to_pick_OSCAR(this,this->particle_monval_b,__x->monval);
        if (bVar3) {
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((this->balance_function_particle_b->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
        }
        bVar3 = decide_to_pick_OSCAR(this,this->particle_monval_bbar,__x->monval);
        if (bVar3) {
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((this->balance_function_particle_bbar->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar7],__x);
        }
      }
    }
    lVar7 = lVar7 + 1;
    ppvVar6 = local_38 + 1;
  } while( true );
}

Assistant:

void particleSamples::filter_particles_into_lists(
    vector<vector<particle_info> *> *full_list) {
    // clean out the previous record
    clear_out_previous_record(particle_list);

    if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1)
        clear_out_previous_record(resonance_list_Sigma0);

    if (net_particle_flag == 1) clear_out_previous_record(anti_particle_list);

    if (reconst_flag == 1) {
        clear_out_previous_record(reconst_list_1);
        clear_out_previous_record(reconst_list_2);
    }

    if (flag_charge_dependence == 1) {
        clear_out_previous_record(positive_charge_hadron_list);
        clear_out_previous_record(negative_charge_hadron_list);
    }

    if (analyze_BF) {
        clear_out_previous_record(balance_function_particle_a);
        clear_out_previous_record(balance_function_particle_abar);
        clear_out_previous_record(balance_function_particle_b);
        clear_out_previous_record(balance_function_particle_bbar);
    }

    int iev = 0;
    for (auto &ev_i : (*full_list)) {
        particle_list->push_back(new vector<particle_info>);
        if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1)
            resonance_list_Sigma0->push_back(new vector<particle_info>);

        if (net_particle_flag == 1)
            anti_particle_list->push_back(new vector<particle_info>);

        if (reconst_flag == 1) {
            reconst_list_1->push_back(new vector<particle_info>);
            reconst_list_2->push_back(new vector<particle_info>);
        }

        if (flag_charge_dependence == 1) {
            positive_charge_hadron_list->push_back(new vector<particle_info>);
            negative_charge_hadron_list->push_back(new vector<particle_info>);
        }

        if (analyze_BF) {
            balance_function_particle_a->push_back(new vector<particle_info>);
            balance_function_particle_abar->push_back(
                new vector<particle_info>);
            balance_function_particle_b->push_back(new vector<particle_info>);
            balance_function_particle_bbar->push_back(
                new vector<particle_info>);
        }

        for (auto &part_i : (*ev_i)) {
            bool pick_flag =
                decide_to_pick_OSCAR(particle_monval, part_i.monval);
            if (pick_flag) {
                (*particle_list)[iev]->push_back(part_i);
            }

            if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
                int resonance_pick_flag =
                    decide_to_pick_resonance(part_i.monval);
                if (resonance_pick_flag == 1)
                    (*resonance_list_Sigma0)[iev]->push_back(part_i);
            }

            if (reconst_flag == 1) {
                int reconst_pick_flag = decide_to_pick_reconst(part_i.monval);
                if (reconst_pick_flag == 1)
                    (*reconst_list_1)[iev]->push_back(part_i);
                else if (reconst_pick_flag == 2)
                    (*reconst_list_2)[iev]->push_back(part_i);
            }
            if (net_particle_flag == 1) {
                int anti_particle_pick_flag =
                    decide_to_pick_anti_particles(part_i.monval);
                if (anti_particle_pick_flag == 1)
                    (*anti_particle_list)[iev]->push_back(part_i);
            }

            if (flag_charge_dependence == 1) {
                int charge_flag = decide_to_pick_charge(part_i.monval);
                if (charge_flag == 1)
                    (*positive_charge_hadron_list)[iev]->push_back(part_i);
                else if (charge_flag == -1)
                    (*negative_charge_hadron_list)[iev]->push_back(part_i);
            }

            if (analyze_BF) {
                if (decide_to_pick_OSCAR(particle_monval_a, part_i.monval))
                    (*balance_function_particle_a)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_abar, part_i.monval))
                    (*balance_function_particle_abar)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_b, part_i.monval))
                    (*balance_function_particle_b)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_bbar, part_i.monval))
                    (*balance_function_particle_bbar)[iev]->push_back(part_i);
            }
        }
        iev++;
    }
}